

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O3

int hugeRead(void *context,char *buffer,int len)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  
  iVar3 = rlen;
  pcVar2 = current;
  iVar1 = curseg;
  iVar5 = -1;
  if (-1 < len && (buffer != (char *)0x0 && context != (void *)0x0)) {
    iVar6 = rlen - len;
    if (iVar6 == 0 || rlen < len) {
      if (curseg < 0x3e9) {
        memcpy(buffer,current,(long)rlen);
        curseg = iVar1 + 1;
        current = (&hugeDocParts->segment)[curseg == 1000];
        sVar4 = strlen(current);
        rlen = (int)sVar4;
        iVar5 = iVar3;
      }
      else {
        rlen = 0;
        iVar5 = 0;
      }
    }
    else {
      memcpy(buffer,current,(ulong)(uint)len);
      current = pcVar2 + (uint)len;
      iVar5 = len;
      rlen = iVar6;
    }
  }
  return iVar5;
}

Assistant:

static int
hugeRead(void *context, char *buffer, int len)
{
    if ((context == NULL) || (buffer == NULL) || (len < 0))
        return (-1);

    if (len >= rlen) {
        if (curseg >= MAX_NODES + 1) {
            rlen = 0;
            return(0);
        }
        len = rlen;
        rlen = 0;
	memcpy(buffer, current, len);
        curseg ++;
        if (curseg == MAX_NODES) {
            current = hugeDocParts->finish;
	} else {
            current = hugeDocParts->segment;
	}
        rlen = strlen(current);
    } else {
	memcpy(buffer, current, len);
	rlen -= len;
        current += len;
    }
    return (len);
}